

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O1

ULONG __thiscall Diligent::anon_unknown_0::DxcBlobWrapper::AddRef(DxcBlobWrapper *this)

{
  atomic<long> *paVar1;
  long lVar2;
  
  LOCK();
  paVar1 = &this->m_RefCount;
  lVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  return lVar2 + 1;
}

Assistant:

AddRef(void) override final
    {
        return m_RefCount.fetch_add(1) + 1;
    }